

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::get_hash_for_descriptor_set_layout
          (StateRecorder *this,VkDescriptorSetLayout layout,Hash *hash)

{
  VkDescriptorSetLayout pVVar1;
  bool bVar2;
  iterator iVar3;
  long *in_FS_OFFSET;
  VkDescriptorSetLayout layout_local;
  
  if (layout == (VkDescriptorSetLayout)0x0) {
    *hash = 0;
  }
  else {
    layout_local = layout;
    iVar3 = std::
            _Hashtable<VkDescriptorSetLayout_T_*,_std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_std::allocator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkDescriptorSetLayout_T_*>,_std::hash<VkDescriptorSetLayout_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->impl->descriptor_set_layout_to_hash)._M_h,&layout_local);
    pVVar1 = layout_local;
    if (iVar3.
        super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar2 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                         ,"Descriptor set layout",layout_local);
      if (bVar2) {
        return false;
      }
      fprintf(_stderr,
              "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
              ,"Descriptor set layout",pVVar1);
      return false;
    }
    *hash = *(Hash *)((long)iVar3.
                            super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>
                            ._M_cur + 0x10);
  }
  return true;
}

Assistant:

bool StateRecorder::get_hash_for_descriptor_set_layout(VkDescriptorSetLayout layout, Hash *hash) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// Allowed by VK_EXT_graphics_pipeline_library.
		*hash = 0;
		return true;
	}

	auto itr = impl->descriptor_set_layout_to_hash.find(layout);
	if (itr == end(impl->descriptor_set_layout_to_hash))
	{
		log_failed_hash("Descriptor set layout", layout);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}